

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::LookupOne
          (Registry *this,Network *aPred,Network *aRet)

{
  uint64_t uVar1;
  DomainId DVar2;
  pointer pNVar3;
  char cVar4;
  int iVar5;
  Status SVar6;
  NetworkArray networks;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  local_38;
  
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x16])();
  pNVar3 = local_38.
           super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar4 = (char)iVar5;
  SVar6 = kNotFound;
  if (cVar4 != '\x01') {
    SVar6 = (cVar4 != '\0') << 2;
  }
  if (cVar4 == '\0') {
    SVar6 = kAmbiguity;
    if ((long)local_38.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      DVar2.mId = ((local_38.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start)->mDomainId).mId;
      aRet->mId = (NetworkId)
                  ((local_38.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start)->mId).mId;
      aRet->mDomainId = (DomainId)DVar2.mId;
      std::__cxx11::string::_M_assign((string *)&aRet->mName);
      uVar1 = pNVar3->mXpan;
      *(undefined8 *)((long)&aRet->mXpan + 6) = *(undefined8 *)((long)&pNVar3->mXpan + 6);
      aRet->mXpan = uVar1;
      std::__cxx11::string::_M_assign((string *)&aRet->mMlp);
      aRet->mCcm = pNVar3->mCcm;
      SVar6 = kSuccess;
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_38);
  return SVar6;
}

Assistant:

Registry::Status Registry::LookupOne(const Network &aPred, Network &aRet)
{
    Registry::Status status;
    NetworkArray     networks;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(aPred, networks))) == Registry::Status::kSuccess);
    VerifyOrExit(networks.size() == 1, status = Registry::Status::kAmbiguity);
    aRet = networks[0];
exit:
    return status;
}